

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

JavascriptPromiseReaction *
TTD::NSSnapValues::InflatePromiseReactionInfo
          (SnapPromiseReactionInfo *reactionInfo,ScriptContext *ctx,InflateMap *inflator)

{
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  bool bVar1;
  RecyclableObject *handler;
  JavascriptPromiseCapability *capabilities;
  JavascriptPromiseReaction *pJVar2;
  JavascriptPromiseReaction *local_40;
  TTD_PTR_ID local_38;
  
  local_38 = reactionInfo->PromiseReactionId;
  this = &inflator->m_promiseDataMap;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this,&local_38);
  if (!bVar1) {
    handler = InflateMap::LookupObject(inflator,reactionInfo->HandlerObjId);
    capabilities = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities,ctx,inflator);
    local_40 = Js::JavascriptLibrary::CreatePromiseReaction_TTD
                         ((ctx->super_ScriptContextBase).javascriptLibrary,handler,capabilities);
    local_38 = reactionInfo->PromiseReactionId;
    JsUtil::
    BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this,&local_38,&local_40);
  }
  local_38 = reactionInfo->PromiseReactionId;
  pJVar2 = (JavascriptPromiseReaction *)
           JsUtil::
           BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(this,&local_38);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseReaction* InflatePromiseReactionInfo(const SnapPromiseReactionInfo* reactionInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId))
            {
                Js::RecyclableObject* handler = inflator->LookupObject(reactionInfo->HandlerObjId);
                Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities, ctx, inflator);

                Js::JavascriptPromiseReaction* res = ctx->GetLibrary()->CreatePromiseReaction_TTD(handler, capabilities);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId);
        }